

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

void SVGChart::MakeExamplePlot6(PPlot *ioPPlot)

{
  PlotData *pPVar1;
  LineDataDrawer *pLVar2;
  LineDataDrawer *theDataDrawer2;
  PlotData *local_60;
  PlotData *theY2;
  PlotData *theX2;
  LineDataDrawer *local_40;
  LineDataDrawer *theDataDrawer1;
  float local_30;
  float local_2c;
  PlotData *pPStack_28;
  float theFac;
  PlotData *theY1;
  PlotData *theX1;
  PPlot *pPStack_10;
  int theI;
  PPlot *ioPPlot_local;
  
  pPStack_10 = ioPPlot;
  std::__cxx11::string::operator=((string *)&(ioPPlot->mPlotBackground).mTitle,"line styles");
  pPVar1 = (PlotData *)operator_new(0x20);
  memset(pPVar1,0,0x20);
  PlotData::PlotData(pPVar1);
  theY1 = pPVar1;
  pPVar1 = (PlotData *)operator_new(0x20);
  memset(pPVar1,0,0x20);
  PlotData::PlotData(pPVar1);
  local_2c = 0.0001;
  pPStack_28 = pPVar1;
  for (theX1._4_4_ = 0; theX1._4_4_ < 0xb; theX1._4_4_ = theX1._4_4_ + 1) {
    local_30 = (float)theX1._4_4_ * 0.001 + 0.0001;
    std::vector<float,_std::allocator<float>_>::push_back(&theY1->super_RealPlotData,&local_30);
    theDataDrawer1._4_4_ = local_2c * (float)theX1._4_4_ * (float)theX1._4_4_ + 0.01;
    std::vector<float,_std::allocator<float>_>::push_back
              (&pPStack_28->super_RealPlotData,(value_type *)((long)&theDataDrawer1 + 4));
  }
  pLVar2 = (LineDataDrawer *)operator_new(0xa8);
  LineDataDrawer::LineDataDrawer(pLVar2);
  (pLVar2->super_DataDrawerBase).field_0x25 = 1;
  (pLVar2->mStyle).mPenWidth = 3;
  local_40 = pLVar2;
  PlotDataContainer::AddXYPlot
            (&pPStack_10->mPlotDataContainer,&theY1->super_PlotDataBase,
             &pPStack_28->super_PlotDataBase,(LegendData *)0x0,(DataDrawerBase *)pLVar2,
             (PlotDataSelection *)0x0);
  pPVar1 = (PlotData *)operator_new(0x20);
  memset(pPVar1,0,0x20);
  PlotData::PlotData(pPVar1);
  theY2 = pPVar1;
  pPVar1 = (PlotData *)operator_new(0x20);
  memset(pPVar1,0,0x20);
  PlotData::PlotData(pPVar1);
  local_60 = pPVar1;
  for (theX1._4_4_ = 0; theX1._4_4_ < 0xb; theX1._4_4_ = theX1._4_4_ + 1) {
    theDataDrawer2._4_4_ = (float)theX1._4_4_ * 0.001 + 0.0001;
    std::vector<float,_std::allocator<float>_>::push_back
              (&theY2->super_RealPlotData,(value_type *)((long)&theDataDrawer2 + 4));
    theDataDrawer2._0_4_ = 0.2 - local_2c * (float)theX1._4_4_ * (float)theX1._4_4_;
    std::vector<float,_std::allocator<float>_>::push_back
              (&local_60->super_RealPlotData,(value_type *)&theDataDrawer2);
  }
  pLVar2 = (LineDataDrawer *)operator_new(0xa8);
  LineDataDrawer::LineDataDrawer(pLVar2);
  (pLVar2->super_DataDrawerBase).field_0x25 = 1;
  (pLVar2->super_DataDrawerBase).field_0x24 = 0;
  PlotDataContainer::AddXYPlot
            (&pPStack_10->mPlotDataContainer,&theY2->super_PlotDataBase,
             &local_60->super_PlotDataBase,(LegendData *)0x0,(DataDrawerBase *)pLVar2,
             (PlotDataSelection *)0x0);
  (pPStack_10->mMargins).mLeft = 0x32;
  (pPStack_10->mMargins).mTop = 0x14;
  return;
}

Assistant:

void MakeExamplePlot6 (PPlot &ioPPlot) {

      int theI;

      ioPPlot.mPlotBackground.mTitle = "line styles";
      PlotData *theX1 = new PlotData ();
      PlotData *theY1 = new PlotData ();
      float theFac = 100.0f/(100*100*100);
      for (theI=0;theI<=10;theI++) {
        theX1->push_back (0.0001+theI*0.001);
        theY1->push_back (0.01+theFac*theI*theI);
      }
      LineDataDrawer *theDataDrawer1 = new LineDataDrawer ();
      theDataDrawer1->mDrawPoint = true;
      theDataDrawer1->mStyle.mPenWidth = 3;
      ioPPlot.mPlotDataContainer.AddXYPlot (theX1, theY1, nullptr, theDataDrawer1);

      PlotData *theX2 = new PlotData ();
      PlotData *theY2 = new PlotData ();
      for (theI=0;theI<=10;theI++) {
        theX2->push_back (0.0001+theI*0.001);
        theY2->push_back (0.2-theFac*theI*theI);
      }
      LineDataDrawer *theDataDrawer2 = new LineDataDrawer ();
      theDataDrawer2->mDrawPoint = true;
      theDataDrawer2->mDrawLine = false;
      ioPPlot.mPlotDataContainer.AddXYPlot (theX2, theY2, nullptr, theDataDrawer2);

      ioPPlot.mMargins.mLeft = 50;
      ioPPlot.mMargins.mTop = 20;
    }